

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosRangeFilter.cpp
# Opt level: O0

size_t __thiscall adios2::helper::RangeFilter::ToSizeT(RangeFilter *this,string *input)

{
  string *activity;
  ulong uVar1;
  size_t pos;
  long value;
  size_t *in_stack_fffffffffffffd48;
  string *in_stack_fffffffffffffd50;
  allocator *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined4 in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  string *in_stack_fffffffffffffd98;
  string *in_stack_fffffffffffffda8;
  string *in_stack_fffffffffffffdb0;
  string local_238 [39];
  allocator local_211;
  string local_210 [39];
  undefined1 local_1e9 [40];
  allocator local_1c1;
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [232];
  ulong local_20;
  string *local_18;
  
  activity = (string *)std::__cxx11::stol(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,0);
  local_18 = activity;
  if ((long)activity < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"Helper",&local_109);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"adiosRangeFilter",&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"ToSizeT",&local_159);
    std::operator+((char *)in_stack_fffffffffffffd98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    std::operator+(in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50);
    ThrowNested<std::invalid_argument>
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,activity,
               in_stack_fffffffffffffd98,in_stack_fffffffffffffd94);
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::~string(local_1a0);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  uVar1 = std::__cxx11::string::size();
  if (local_20 < uVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c0,"Helper",&local_1c1);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_1e9 + 1),"adiosRangeFilter",(allocator *)__lhs);
    __rhs = &local_211;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_210,"ToSizeT",__rhs);
    std::operator+((char *)in_stack_fffffffffffffd98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    std::operator+(__lhs,(char *)__rhs);
    ThrowNested<std::invalid_argument>
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,activity,
               in_stack_fffffffffffffd98,in_stack_fffffffffffffd94);
    std::__cxx11::string::~string(local_238);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffda8);
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
    std::__cxx11::string::~string((string *)(local_1e9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1e9);
    std::__cxx11::string::~string(local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  }
  return (size_t)local_18;
}

Assistant:

size_t RangeFilter::ToSizeT(const std::string &input)
{
    long value;
    size_t pos;
    try
    {
        value = std::stol(input, &pos);
    }
    catch (...)
    {
        helper::ThrowNested<std::invalid_argument>("Helper", "adiosRangeFilter", "ToSizeT",
                                                   "could not cast string '" + input +
                                                       "' to number ");
    }
    if (value < 0L)
    {
        helper::ThrowNested<std::invalid_argument>("Helper", "adiosRangeFilter", "ToSizeT",
                                                   "Negative number '" + input +
                                                       "' not supported in range selections!");
    }
    if (pos < input.size())
    {
        helper::ThrowNested<std::invalid_argument>(
            "Helper", "adiosRangeFilter", "ToSizeT",
            "could not cast the entire string '" + input +
                "' to a single integer number. RangeFilter accepts a "
                "space-separated list of i:j:k expressions where i,j,k are "
                "non-negative integers or the character 'n'");
    }
    return static_cast<size_t>(value);
}